

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestBuildHandler::GetMakeCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  allocator local_251;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  string configType;
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  allocator local_41;
  string local_40;
  byte local_19;
  cmCTestBuildHandler *local_18;
  cmCTestBuildHandler *this_local;
  string *makeCommand;
  
  local_19 = 0;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = this;
  this_local = (cmCTestBuildHandler *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"MakeCommand",&local_41);
  cmCTest::GetCTestConfiguration(__return_storage_ptr__,pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar3 = std::operator<<((ostream *)local_1d0,"MakeCommand:");
  poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
  std::operator<<(poVar3,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x123,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(configType.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::string((string *)local_210,(string *)psVar5);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_210,"");
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"DefaultCTestConfigurationType",&local_251);
    cmCTest::GetCTestConfiguration(&local_230,pcVar1,&local_250);
    std::__cxx11::string::operator=((string *)local_210,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_210,"");
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_210,"Release");
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"${CTEST_CONFIGURATION_TYPE}",pcVar4);
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_210);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBuildHandler::GetMakeCommand()
{
  std::string makeCommand
    = this->CTest->GetCTestConfiguration("MakeCommand");
  cmCTestOptionalLog(this->CTest,
    HANDLER_VERBOSE_OUTPUT, "MakeCommand:" << makeCommand << "\n",
    this->Quiet);

  std::string configType = this->CTest->GetConfigType();
  if (configType == "")
    {
    configType
      = this->CTest->GetCTestConfiguration("DefaultCTestConfigurationType");
    }
  if (configType == "")
    {
    configType = "Release";
    }

  cmSystemTools::ReplaceString(makeCommand,
    "${CTEST_CONFIGURATION_TYPE}", configType.c_str());

  return makeCommand;
}